

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_script_from_number
              (int64_t number,miniscript_node_t *parent,uchar *script,size_t script_len,
              size_t *write_len)

{
  size_t bytes_len;
  size_t output_len;
  uchar number_bytes [18];
  int local_3c;
  int ret;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  miniscript_node_t *parent_local;
  int64_t number_local;
  
  local_3c = 0;
  if ((parent == (miniscript_node_t *)0x0) || (parent->info != (miniscript_item_t *)0x0)) {
    if (script_len < 0x12) {
      number_local._4_4_ = -2;
    }
    else {
      if (number == 0) {
        *script = '\0';
        *write_len = 1;
      }
      else if (number == -1) {
        *script = 'O';
        *write_len = 1;
      }
      else if ((number < 1) || (0x10 < number)) {
        bytes_len = scriptint_to_bytes(number,(uchar *)&output_len);
        if (bytes_len == 0) {
          return -2;
        }
        local_3c = wally_script_push_from_bytes
                             ((uchar *)&output_len,bytes_len,0,script,script_len,write_len);
      }
      else {
        *script = (char)number + 'P';
        *write_len = 1;
      }
      number_local._4_4_ = local_3c;
    }
  }
  else {
    number_local._4_4_ = -2;
  }
  return number_local._4_4_;
}

Assistant:

static int generate_script_from_number(
    int64_t number,
    struct miniscript_node_t *parent,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret = WALLY_OK;
    if (parent && !parent->info)
        return WALLY_EINVAL;

    if (script_len < DESCRIPTOR_NUMBER_BYTE_MAX_LENGTH)
        return WALLY_EINVAL;

    if (number == 0) {
        script[0] = 0;
        *write_len = 1;
    } else if (number == -1) {
        script[0] = OP_1NEGATE;
        *write_len = 1;
    } else if ((number > 0) && (number <= 16)) {
        script[0] = OP_1 + number - 1;
        *write_len = 1;
    } else {
        unsigned char number_bytes[DESCRIPTOR_NUMBER_BYTE_MAX_LENGTH];
        size_t output_len = scriptint_to_bytes(number, number_bytes);
        if (!output_len)
            return WALLY_EINVAL;

        ret = wally_script_push_from_bytes(number_bytes, output_len, 0,
                                           script, script_len, write_len);
    }
    return ret;
}